

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

void update_loff(hts_idx_t *idx,int i,int free_lidx)

{
  kh_bin_t *h;
  khint_t kVar1;
  int iVar2;
  lidx_t *plVar3;
  bool bVar4;
  uint64_t local_48;
  uint64_t uStack_38;
  int bot_bin;
  uint64_t offset0;
  int l;
  khint_t k;
  lidx_t *lidx;
  bidx_t *bidx;
  int free_lidx_local;
  int i_local;
  hts_idx_t *idx_local;
  
  h = idx->bidx[i];
  plVar3 = idx->lidx + i;
  uStack_38 = 0;
  if (h == (kh_bin_t *)0x0) {
    offset0._0_4_ = 1;
  }
  else {
    kVar1 = kh_get_bin(h,idx->n_bins + 1);
    if (kVar1 != h->n_buckets) {
      uStack_38 = (h->vals[kVar1].list)->u;
    }
    offset0._0_4_ = 0;
    while( true ) {
      bVar4 = false;
      if ((int)offset0 < plVar3->n) {
        bVar4 = plVar3->offset[(int)offset0] == 0xffffffffffffffff;
      }
      if (!bVar4) break;
      plVar3->offset[(int)offset0] = uStack_38;
      offset0._0_4_ = (int)offset0 + 1;
    }
  }
  for (; (int)offset0 < plVar3->n; offset0._0_4_ = (int)offset0 + 1) {
    if (plVar3->offset[(int)offset0] == 0xffffffffffffffff) {
      plVar3->offset[(int)offset0] = plVar3->offset[(int)offset0 + -1];
    }
  }
  if (h != (kh_bin_t *)0x0) {
    for (offset0._4_4_ = 0; offset0._4_4_ != h->n_buckets; offset0._4_4_ = offset0._4_4_ + 1) {
      if ((h->flags[offset0._4_4_ >> 4] >> (sbyte)((offset0._4_4_ & 0xf) << 1) & 3) == 0) {
        if (h->keys[offset0._4_4_] < (uint)idx->n_bins) {
          iVar2 = hts_bin_bot(h->keys[offset0._4_4_],idx->n_lvls);
          if (iVar2 < plVar3->n) {
            local_48 = plVar3->offset[iVar2];
          }
          else {
            local_48 = 0;
          }
          h->vals[offset0._4_4_].loff = local_48;
        }
        else {
          h->vals[offset0._4_4_].loff = 0;
        }
      }
    }
    if (free_lidx != 0) {
      free(plVar3->offset);
      plVar3->n = 0;
      plVar3->m = 0;
      plVar3->offset = (uint64_t *)0x0;
    }
  }
  return;
}

Assistant:

static void update_loff(hts_idx_t *idx, int i, int free_lidx)
{
    bidx_t *bidx = idx->bidx[i];
    lidx_t *lidx = &idx->lidx[i];
    khint_t k;
    int l;
    uint64_t offset0 = 0;
    if (bidx) {
        k = kh_get(bin, bidx, META_BIN(idx));
        if (k != kh_end(bidx))
            offset0 = kh_val(bidx, k).list[0].u;
        for (l = 0; l < lidx->n && lidx->offset[l] == (uint64_t)-1; ++l)
            lidx->offset[l] = offset0;
    } else l = 1;
    for (; l < lidx->n; ++l) // fill missing values
        if (lidx->offset[l] == (uint64_t)-1)
            lidx->offset[l] = lidx->offset[l-1];
    if (bidx == 0) return;
    for (k = kh_begin(bidx); k != kh_end(bidx); ++k) // set loff
        if (kh_exist(bidx, k))
        {
            if ( kh_key(bidx, k) < idx->n_bins )
            {
                int bot_bin = hts_bin_bot(kh_key(bidx, k), idx->n_lvls);
                // disable linear index if bot_bin out of bounds
                kh_val(bidx, k).loff = bot_bin < lidx->n ? lidx->offset[bot_bin] : 0;
            }
            else
                kh_val(bidx, k).loff = 0;
        }
    if (free_lidx) {
        free(lidx->offset);
        lidx->m = lidx->n = 0;
        lidx->offset = 0;
    }
}